

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void test_large_image_performance_rgb8(int loop_count)

{
  failure *error;
  int loop_count_local;
  
  std::operator<<((ostream *)&std::cout,"Test Large Images Performance\n");
  test_portable_anymap_file("test/rgb8bit/artificial.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/big_building.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/big_tree.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/bridge.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/cathedral.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/deer.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/fireworks.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/flower_foveon.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/hdr.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/leaves_iso_200.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/leaves_iso_1600.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/nightshot_iso_100.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/nightshot_iso_1600.ppm",loop_count);
  test_portable_anymap_file("test/rgb8bit/spider_web.ppm",loop_count);
  return;
}

Assistant:

void test_large_image_performance_rgb8(const int loop_count)
{
    // Note: the test images are very large and not included in the repository.
    //       The images can be downloaded from: http://imagecompression.info/test_images/

#ifdef _DEBUG
    cout << "NOTE: running performance test in debug mode, performance may be slow!\n";
#endif
    cout << "Test Large Images Performance\n";

    try
    {
        test_portable_anymap_file("test/rgb8bit/artificial.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/big_building.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/big_tree.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/bridge.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/cathedral.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/deer.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/fireworks.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/flower_foveon.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/hdr.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/leaves_iso_200.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/leaves_iso_1600.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/nightshot_iso_100.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/nightshot_iso_1600.ppm", loop_count);
        test_portable_anymap_file("test/rgb8bit/spider_web.ppm", loop_count);
    }
    catch (const istream::failure& error)
    {
        cout << "Test failed " << error.what() << "\n";
    }
}